

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall mp::StringFileWriter::~StringFileWriter(StringFileWriter *this)

{
  if ((this->cnt_ == 0) && (this->fTriedOpen_ == false)) {
    std::function<mp::File_(bool)>::operator()
              ((function<mp::File_(bool)> *)&stack0xfffffffffffffff0,(bool)((char)this + '\b'));
    File::~File((File *)&stack0xfffffffffffffff0);
  }
  File::~File(&this->nm);
  std::_Function_base::~_Function_base(&(this->opener_).super__Function_base);
  return;
}

Assistant:

~StringFileWriter() {
    if (!cnt_ && !fTriedOpen_)  // remove file if not opened
      opener_(true);            // or nothing written
  }